

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O2

bool Memory::HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
               (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block,
               SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list,
               SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *tail)

{
  for (; (list != block && (list != tail));
      list = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(list)) {
  }
  return list != tail;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }